

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_format(lua_State *L)

{
  int arg;
  char *__s;
  ulong __n;
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  ushort **ppuVar10;
  void *pvVar11;
  lconv *plVar12;
  undefined1 *puVar13;
  size_t sVar14;
  byte bVar15;
  char *pcVar16;
  lua_Number lVar17;
  char form [32];
  size_t l;
  size_t sfl;
  luaL_Buffer b;
  undefined4 local_4ac;
  char local_4a8;
  undefined1 local_4a7;
  char local_4a6 [38];
  size_t local_480 [2];
  size_t local_470;
  char *local_468;
  size_t local_460;
  size_t local_458;
  luaL_Buffer local_450;
  
  local_4ac = lua_gettop(L);
  pcVar4 = luaL_checklstring(L,1,&local_458);
  luaL_buffinit(L,&local_450);
  if (0 < (long)local_458) {
    pcVar16 = pcVar4 + local_458;
    iVar3 = 1;
    local_468 = pcVar16;
    do {
      cVar1 = *pcVar4;
      if (cVar1 != '%') {
        if (local_450.size <= local_450.n) {
          luaL_prepbuffsize(&local_450,1);
          cVar1 = *pcVar4;
        }
        pcVar4 = pcVar4 + 1;
        local_450.b[local_450.n] = cVar1;
LAB_00118af6:
        local_450.n = local_450.n + 1;
        goto LAB_00118cf6;
      }
      __s = pcVar4 + 1;
      if (pcVar4[1] == '%') {
        cVar1 = '%';
        if (local_450.size <= local_450.n) {
          luaL_prepbuffsize(&local_450,1);
          cVar1 = *__s;
        }
        pcVar4 = pcVar4 + 2;
        local_450.b[local_450.n] = cVar1;
        goto LAB_00118af6;
      }
      pcVar4 = luaL_prepbuffsize(&local_450,0x78);
      arg = iVar3 + 1;
      if (local_4ac <= iVar3) {
        iVar3 = luaL_argerror(L,arg,"no value");
        return iVar3;
      }
      sVar5 = strspn(__s,"-+#0 123456789.");
      __n = sVar5 + 1;
      if (0x15 < __n) {
        luaL_error(L,"invalid format (too long)");
      }
      local_4a8 = '%';
      memcpy(&local_4a7,__s,__n);
      local_4a6[sVar5] = '\0';
      bVar15 = __s[sVar5];
      sVar5 = 0x78;
      if (bVar15 < 0x58) {
        if (bVar15 != 0x41) {
          if ((bVar15 != 0x45) && (bVar15 != 0x47)) goto switchD_00118b9f_caseD_59;
          goto switchD_00118b9f_caseD_65;
        }
switchD_00118b9f_caseD_61:
        checkformat(L,&local_4a8,"-+#0 ",1);
        addlenmod(&local_4a8,"");
        lVar17 = luaL_checknumber(L,arg);
        sVar5 = 0x78;
        goto LAB_00118c77;
      }
      pcVar16 = "-+0 ";
      switch(bVar15) {
      case 0x58:
      case 0x6f:
      case 0x78:
        pcVar16 = "-#0";
        break;
      default:
switchD_00118b9f_caseD_59:
        iVar3 = luaL_error(L,"invalid conversion \'%s\' to \'format\'",&local_4a8);
        return iVar3;
      case 0x61:
        goto switchD_00118b9f_caseD_61;
      case 99:
        checkformat(L,&local_4a8,"-",0);
        uVar8 = luaL_checkinteger(L,arg);
        uVar2 = snprintf(pcVar4,0x78,&local_4a8,uVar8 & 0xffffffff);
        goto LAB_00118cde;
      case 100:
      case 0x69:
        break;
      case 0x65:
      case 0x67:
        goto switchD_00118b9f_caseD_65;
      case 0x66:
        sVar5 = 0x1a2;
        pcVar4 = luaL_prepbuffsize(&local_450,0x1a2);
        goto switchD_00118b9f_caseD_65;
      case 0x70:
        pcVar6 = (char *)lua_topointer(L,arg);
        checkformat(L,&local_4a8,"-",0);
        if (pcVar6 == (char *)0x0) {
          sVar5 = strlen(&local_4a8);
          *(undefined1 *)((long)&local_4ac + sVar5 + 3) = 0x73;
          pcVar6 = "(null)";
        }
        goto LAB_00118cd1;
      case 0x71:
        if (local_4a6[0] != '\0') {
          iVar3 = luaL_error(L,"specifier \'%%q\' cannot have modifiers");
          return iVar3;
        }
        uVar2 = lua_type(L,arg);
        if (1 < uVar2) {
          if (uVar2 != 3) {
            if (uVar2 == 4) {
              pcVar4 = lua_tolstring(L,arg,&local_460);
              local_470 = local_460;
              if (local_450.size <= local_450.n) {
                luaL_prepbuffsize(&local_450,1);
              }
              uVar8 = local_450.n + 1;
              local_450.b[local_450.n] = '\"';
              local_450.n = uVar8;
              if (local_470 != 0) {
                sVar14 = 0;
                do {
                  bVar15 = pcVar4[sVar14];
                  uVar8 = (ulong)bVar15;
                  if (((uVar8 == 10) || (bVar15 == 0x5c)) || (bVar15 == 0x22)) {
                    sVar9 = local_450.n;
                    if (local_450.size <= local_450.n) {
                      luaL_prepbuffsize(&local_450,1);
                      sVar9 = local_450.n;
                    }
                    local_450.n = sVar9 + 1;
                    local_450.b[sVar9] = '\\';
                    if (local_450.size <= local_450.n) {
                      luaL_prepbuffsize(&local_450,1);
                    }
                    local_450.b[local_450.n] = pcVar4[sVar14];
                    local_450.n = local_450.n + 1;
                  }
                  else {
                    ppuVar10 = __ctype_b_loc();
                    if (((*ppuVar10)[uVar8] & 2) == 0) {
                      if (local_450.size <= local_450.n) {
                        luaL_prepbuffsize(&local_450,1);
                        bVar15 = pcVar4[sVar14];
                      }
                      local_450.b[local_450.n] = bVar15;
                      local_450.n = local_450.n + 1;
                    }
                    else {
                      pcVar16 = "\\%03d";
                      if (((*ppuVar10)[(byte)pcVar4[sVar14 + 1]] >> 0xb & 1) == 0) {
                        pcVar16 = "\\%d";
                      }
                      snprintf((char *)local_480,10,pcVar16,uVar8);
                      luaL_addstring(&local_450,(char *)local_480);
                    }
                  }
                  sVar14 = sVar14 + 1;
                } while (local_470 != sVar14);
              }
              if (local_450.size <= local_450.n) {
                luaL_prepbuffsize(&local_450,1);
              }
              local_450.b[local_450.n] = '\"';
              local_450.n = local_450.n + 1;
            }
            else {
              luaL_argerror(L,arg,"value has no literal form");
            }
            goto LAB_0011917a;
          }
          pcVar4 = luaL_prepbuffsize(&local_450,0x78);
          iVar3 = lua_isinteger(L,arg);
          if (iVar3 == 0) {
            lVar17 = lua_tonumberx(L,arg,(int *)0x0);
            pcVar16 = "1e9999";
            if (((INFINITY <= lVar17) || (pcVar16 = "-1e9999", lVar17 <= -INFINITY)) ||
               (pcVar16 = "(0/0)", NAN(lVar17))) {
              pcVar6 = "%s";
              goto LAB_00119160;
            }
            uVar2 = snprintf(pcVar4,0x78,"%a","(0/0)");
            uVar8 = (ulong)uVar2;
            pvVar11 = memchr(pcVar4,0x2e,(ulong)uVar2);
            if (pvVar11 == (void *)0x0) {
              plVar12 = localeconv();
              puVar13 = (undefined1 *)memchr(pcVar4,(int)*plVar12->decimal_point,(ulong)uVar2);
              if (puVar13 != (undefined1 *)0x0) {
                *puVar13 = 0x2e;
              }
            }
          }
          else {
            pcVar16 = (char *)lua_tointegerx(L,arg,(int *)0x0);
            pcVar6 = "%lld";
LAB_00119160:
            uVar2 = snprintf(pcVar4,0x78,pcVar6,pcVar16);
            uVar8 = (ulong)uVar2;
          }
          local_450.n = local_450.n + uVar8;
          goto LAB_0011917a;
        }
        uVar8 = 0;
        luaL_tolstring(L,arg,(size_t *)0x0);
        luaL_addvalue(&local_450);
        goto LAB_00118ce3;
      case 0x73:
        pcVar16 = luaL_tolstring(L,arg,local_480);
        sVar5 = local_480[0];
        if (local_4a6[0] != '\0') {
          sVar7 = strlen(pcVar16);
          if (sVar5 != sVar7) {
            luaL_argerror(L,arg,"string contains zeros");
          }
          checkformat(L,&local_4a8,"-",1);
          pcVar6 = strchr(&local_4a8,0x2e);
          if ((pcVar6 != (char *)0x0) || (local_480[0] < 100)) {
            uVar2 = snprintf(pcVar4,0x78,&local_4a8,pcVar16);
            lua_settop(L,-2);
            goto LAB_00118cde;
          }
        }
        luaL_addvalue(&local_450);
LAB_0011917a:
        uVar8 = 0;
        goto LAB_00118ce3;
      case 0x75:
        pcVar16 = "-0";
      }
      pcVar6 = (char *)luaL_checkinteger(L,arg);
      checkformat(L,&local_4a8,pcVar16,1);
      addlenmod(&local_4a8,"ll");
LAB_00118cd1:
      uVar2 = snprintf(pcVar4,0x78,&local_4a8,pcVar6);
LAB_00118cde:
      uVar8 = (ulong)uVar2;
LAB_00118ce3:
      pcVar4 = __s + __n;
      local_450.n = local_450.n + uVar8;
      pcVar16 = local_468;
      iVar3 = arg;
LAB_00118cf6:
    } while (pcVar4 < pcVar16);
  }
  luaL_pushresult(&local_450);
  return 1;
switchD_00118b9f_caseD_65:
  lVar17 = luaL_checknumber(L,arg);
  checkformat(L,&local_4a8,"-+#0 ",1);
  addlenmod(&local_4a8,"");
LAB_00118c77:
  uVar2 = snprintf(pcVar4,sVar5,&local_4a8,lVar17);
  goto LAB_00118cde;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  const char *flags;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      unsigned maxitem = MAX_ITEM;  /* maximum length for the result */
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put result */
      int nb = 0;  /* number of bytes in result */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = getformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          checkformat(L, form, L_FMTFLAGSC, 0);
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
          flags = L_FMTFLAGSI;
          goto intcase;
        case 'u':
          flags = L_FMTFLAGSU;
          goto intcase;
        case 'o': case 'x': case 'X':
          flags = L_FMTFLAGSX;
         intcase: {
          lua_Integer n = luaL_checkinteger(L, arg);
          checkformat(L, form, flags, 1);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          checkformat(L, form, L_FMTFLAGSC, 0);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            checkformat(L, form, L_FMTFLAGSC, 1);
            if (strchr(form, '.') == NULL && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(cast_uint(nb) < maxitem);
      luaL_addsize(&b, cast_uint(nb));
    }
  }
  luaL_pushresult(&b);
  return 1;
}